

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int calc_feat_idx(acmod_t *acmod,int frame_idx)

{
  int iVar1;
  int local_24;
  int feat_idx;
  int n_backfr;
  int frame_idx_local;
  acmod_t *acmod_local;
  
  iVar1 = acmod->n_feat_alloc - acmod->n_feat_frame;
  if ((frame_idx < 0) || (iVar1 < acmod->output_frame - frame_idx)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
            ,0x415,"Frame %d outside queue of %d frames, %d alloc (%d > %d), cannot score\n",
            (ulong)(uint)frame_idx,(ulong)(uint)acmod->n_feat_frame,acmod->n_feat_alloc,
            acmod->output_frame - frame_idx,iVar1);
    acmod_local._4_4_ = -1;
  }
  else {
    local_24 = ((acmod->feat_outidx + frame_idx) - acmod->output_frame) % acmod->n_feat_alloc;
    if (local_24 < 0) {
      local_24 = acmod->n_feat_alloc + local_24;
    }
    acmod_local._4_4_ = local_24;
  }
  return acmod_local._4_4_;
}

Assistant:

static int
calc_feat_idx(acmod_t *acmod, int frame_idx)
{
    int n_backfr, feat_idx;

    n_backfr = acmod->n_feat_alloc - acmod->n_feat_frame;
    if (frame_idx < 0 || acmod->output_frame - frame_idx > n_backfr) {
        E_ERROR("Frame %d outside queue of %d frames, %d alloc (%d > %d), "
                "cannot score\n", frame_idx, acmod->n_feat_frame,
                acmod->n_feat_alloc, acmod->output_frame - frame_idx,
                n_backfr);
        return -1;
    }

    /* Get the index in feat_buf/framepos of the frame to be scored. */
    feat_idx = (acmod->feat_outidx + frame_idx - acmod->output_frame) %
               acmod->n_feat_alloc;
    if (feat_idx < 0)
        feat_idx += acmod->n_feat_alloc;

    return feat_idx;
}